

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

void __thiscall Gluco::Solver::printIncrementalStats(Solver *this)

{
  puts("c---------- Glucose Stats -------------------------");
  printf("c restarts              : %ld\n",this->starts);
  printf("c nb ReduceDB           : %ld\n",this->nbReduceDB);
  printf("c nb removed Clauses    : %ld\n",this->nbRemovedClauses);
  printf("c nb learnts DL2        : %ld\n",this->nbDL2);
  printf("c nb learnts size 2     : %ld\n",this->nbBin);
  printf("c nb learnts size 1     : %ld\n",this->nbUn);
  printf("c conflicts             : %ld\n",this->conflicts);
  printf("c decisions             : %ld\n",this->decisions);
  printf("c propagations          : %ld\n",this->propagations);
  printf("c SAT Calls             : %d in %g seconds\n",this->totalTime4Sat,
         (ulong)(uint)this->nbSatCalls);
  printf("c UNSAT Calls           : %d in %g seconds\n",this->totalTime4Unsat,
         (ulong)(uint)this->nbUnsatCalls);
  puts("c--------------------------------------------------");
  return;
}

Assistant:

void Solver::printIncrementalStats() {

  printf("c---------- Glucose Stats -------------------------\n");
  printf("c restarts              : %ld\n", starts);
  printf("c nb ReduceDB           : %ld\n", nbReduceDB);
  printf("c nb removed Clauses    : %ld\n", nbRemovedClauses);
  printf("c nb learnts DL2        : %ld\n", nbDL2);
  printf("c nb learnts size 2     : %ld\n", nbBin);
  printf("c nb learnts size 1     : %ld\n", nbUn);

  printf("c conflicts             : %ld\n", conflicts);
  printf("c decisions             : %ld\n", decisions);
  printf("c propagations          : %ld\n", propagations);

  printf("c SAT Calls             : %d in %g seconds\n", nbSatCalls,   totalTime4Sat);
  printf("c UNSAT Calls           : %d in %g seconds\n", nbUnsatCalls, totalTime4Unsat);
  printf("c--------------------------------------------------\n");


}